

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Subscription_deleteMembers(UA_Subscription *subscription,UA_Server *server)

{
  UA_MonitoredItem *pUVar1;
  UA_MonitoredItem **ppUVar2;
  UA_NotificationMessageEntry *pUVar3;
  UA_NotificationMessageEntry **ppUVar4;
  anon_struct_16_2_4dd83919_for_listEntry *paVar5;
  UA_MonitoredItem *monitoredItem;
  UA_NotificationMessageEntry *__ptr;
  
  Subscription_unregisterPublishJob(server,subscription);
  monitoredItem = (subscription->monitoredItems).lh_first;
  while (monitoredItem != (UA_MonitoredItem *)0x0) {
    pUVar1 = (monitoredItem->listEntry).le_next;
    ppUVar2 = (monitoredItem->listEntry).le_prev;
    if (pUVar1 != (UA_MonitoredItem *)0x0) {
      (pUVar1->listEntry).le_prev = ppUVar2;
    }
    *ppUVar2 = pUVar1;
    MonitoredItem_delete(server,monitoredItem);
    monitoredItem = pUVar1;
  }
  __ptr = (subscription->retransmissionQueue).tqh_first;
  while (__ptr != (UA_NotificationMessageEntry *)0x0) {
    pUVar3 = (__ptr->listEntry).tqe_next;
    paVar5 = &pUVar3->listEntry;
    if (pUVar3 == (UA_NotificationMessageEntry *)0x0) {
      paVar5 = (anon_struct_16_2_4dd83919_for_listEntry *)&subscription->retransmissionQueue;
    }
    ppUVar4 = (__ptr->listEntry).tqe_prev;
    paVar5->tqe_prev = ppUVar4;
    *ppUVar4 = pUVar3;
    UA_NotificationMessage_deleteMembers(&__ptr->message);
    free(__ptr);
    __ptr = pUVar3;
  }
  subscription->retransmissionQueueSize = 0;
  return;
}

Assistant:

void UA_Subscription_deleteMembers(UA_Subscription *subscription, UA_Server *server) {
    Subscription_unregisterPublishJob(server, subscription);

    /* Delete monitored Items */
    UA_MonitoredItem *mon, *tmp_mon;
    LIST_FOREACH_SAFE(mon, &subscription->monitoredItems, listEntry, tmp_mon) {
        LIST_REMOVE(mon, listEntry);
        MonitoredItem_delete(server, mon);
    }

    /* Delete Retransmission Queue */
    UA_NotificationMessageEntry *nme, *nme_tmp;
    TAILQ_FOREACH_SAFE(nme, &subscription->retransmissionQueue, listEntry, nme_tmp) {
        TAILQ_REMOVE(&subscription->retransmissionQueue, nme, listEntry);
        UA_NotificationMessage_deleteMembers(&nme->message);
        UA_free(nme);
    }
    subscription->retransmissionQueueSize = 0;
}